

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.h
# Opt level: O3

char * aiScene::GetShortFilename(char *filename)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar1 = strrchr(filename,0x2f);
  if (pcVar1 == (char *)0x0) {
    pcVar1 = strrchr(filename,0x5c);
  }
  pcVar2 = pcVar1 + 1;
  if (pcVar1 == (char *)0x0) {
    pcVar2 = filename;
  }
  return pcVar2;
}

Assistant:

static const char* GetShortFilename(const char* filename) {
        const char* lastSlash = strrchr(filename, '/');
        if (lastSlash == nullptr) {
            lastSlash = strrchr(filename, '\\');
        }
        const char* shortFilename = lastSlash != nullptr ? lastSlash + 1 : filename;
        return shortFilename;
    }